

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers_test.cpp
# Opt level: O2

void __thiscall Sampler_ConsistentValues_Test::TestBody(Sampler_ConsistentValues_Test *this)

{
  pointer pPVar1;
  pointer pfVar2;
  HaltonSampler *this_00;
  Allocator AVar3;
  undefined8 *puVar4;
  ZSobolSampler *pZVar5;
  PMJ02BNSampler *this_01;
  SobolSampler *pSVar6;
  int iVar7;
  uint sampleIndex;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
  *this_02;
  int s;
  long lVar11;
  bool bVar12;
  Float FVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Point2i resolution;
  Tuple2<pbrt::Point2,_float> local_390;
  AssertionResult gtest_ar;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  AssertHelper local_358;
  uint local_34c;
  TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
  *local_348;
  vector<float,_std::allocator<float>_> *local_340;
  vector<float,_std::allocator<float>_> s1d [16];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> s2d [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  samplers.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = 100;
  resolution.super_Tuple2<pbrt::Point2,_int>.y = 0x65;
  samplers.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  samplers.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (HaltonSampler *)operator_new(0x38);
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::HaltonSampler::HaltonSampler(this_00,0x10,&resolution,PermuteDigits,0,AVar3);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)this_00 | 0x3000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0x10;
  puVar4[1] = 0x853c49e6748fea9b;
  puVar4[2] = 0xda3e39cb94b95bdb;
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x1000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0x10;
  puVar4[1] = 0;
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x4000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0x100000010;
  puVar4[1] = 0;
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x4000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0x200000010;
  puVar4[1] = 0;
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x4000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x18);
  *puVar4 = 0x300000010;
  puVar4[1] = 0;
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x4000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x18);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x4000000000000);
  *puVar4 = 0x400000010;
  puVar4[1] = 0;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pZVar5 = (ZSobolSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler(pZVar5,0x10,resolution,None,0);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pZVar5 | 0x6000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pZVar5 = (ZSobolSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler(pZVar5,0x10,resolution,CranleyPatterson,0);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pZVar5 | 0x6000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pZVar5 = (ZSobolSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler(pZVar5,0x10,resolution,PermuteDigits,0);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pZVar5 | 0x6000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pZVar5 = (ZSobolSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler(pZVar5,0x10,resolution,FastOwen,0);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pZVar5 | 0x6000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pZVar5 = (ZSobolSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler(pZVar5,0x10,resolution,Owen,0);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pZVar5 | 0x6000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  this_01 = (PMJ02BNSampler *)operator_new(0x28);
  AVar3.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::PMJ02BNSampler::PMJ02BNSampler(this_01,0x10,0,AVar3);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)this_01 | 0x7000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  puVar4 = (undefined8 *)operator_new(0x30);
  *puVar4 = 0x400000004;
  *(undefined4 *)(puVar4 + 1) = 0;
  *(undefined1 *)((long)puVar4 + 0xc) = 1;
  puVar4[2] = 0x853c49e6748fea9b;
  puVar4[3] = 0xda3e39cb94b95bdb;
  puVar4[4] = 0;
  puVar4[5] = 0;
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)puVar4 | 0x2000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pSVar6 = (SobolSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler(pSVar6,0x10,&resolution,None);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pSVar6 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pSVar6 = (SobolSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler(pSVar6,0x10,&resolution,CranleyPatterson);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pSVar6 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pSVar6 = (SobolSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler(pSVar6,0x10,&resolution,PermuteDigits);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pSVar6 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pSVar6 = (SobolSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler(pSVar6,0x10,&resolution,Owen);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pSVar6 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  pSVar6 = (SobolSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler(pSVar6,0x10,&resolution,FastOwen);
  s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)pSVar6 | 0x5000000000000);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::
  emplace_back<pbrt::SamplerHandle>(&samplers,(SamplerHandle *)s1d);
  local_348 = (TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
               *)samplers.
                 super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                  *)samplers.
                    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start; this_02 != local_348;
      this_02 = this_02 + 8) {
    s1d[0xd].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[0xd].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[0xe].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[0xe].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[0xe].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[0xf].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[0xf].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[0xf].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[10].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[0xb].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[0xb].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[0xb].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[0xc].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[0xc].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[0xc].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[0xd].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[8].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[8].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[8].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[9].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[9].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[9].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[10].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[10].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[6].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[6].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[6].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[7].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[7].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[7].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[4].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[4].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[4].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s1d[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    s1d[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    s1d[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    s2d[0xd].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[0xd].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[0xe].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[0xe].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[0xe].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[0xf].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[0xf].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[0xf].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[10].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[0xb].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[0xb].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[0xb].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[0xc].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[0xc].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[0xc].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[0xd].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[8].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[8].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[8].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[9].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[9].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[9].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[10].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[10].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[5].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[5].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[6].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[6].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[6].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[7].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[7].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[7].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[2].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[3].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[3].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[3].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[4].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[4].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[4].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[5].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[0].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[0].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[0].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[1].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[1].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    s2d[1].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    s2d[2].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    s2d[2].super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x5000000;
      pbrt::SamplerHandle::StartPixelSample
                ((SamplerHandle *)this_02,(Point2i *)&gtest_ar,(int)lVar11,0);
      iVar7 = 10;
      while (bVar12 = iVar7 != 0, iVar7 = iVar7 + -1, bVar12) {
        auVar14._0_8_ =
             pbrt::
             TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(this_02);
        auVar14._8_56_ = extraout_var;
        gtest_ar._0_8_ = vmovlps_avx(auVar14._0_16_);
        std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
        emplace_back<pbrt::Point2<float>>
                  ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)(s2d + lVar11)
                   ,(Point2<float> *)&gtest_ar);
        FVar13 = pbrt::
                 TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(this_02);
        gtest_ar._0_4_ = FVar13;
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  (s1d + lVar11,(float *)&gtest_ar);
      }
    }
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0x6000000;
    pbrt::SamplerHandle::StartPixelSample((SamplerHandle *)this_02,(Point2i *)&gtest_ar,10,0);
    pbrt::
    TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
    ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(this_02);
    pbrt::
    TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
    ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(this_02);
    pbrt::
    TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
    ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(this_02);
    sampleIndex = 0xf;
    while (-1 < (int)sampleIndex) {
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x5000000;
      pbrt::SamplerHandle::StartPixelSample
                ((SamplerHandle *)this_02,(Point2i *)&gtest_ar,sampleIndex,0);
      lVar10 = 0;
      lVar11 = 0;
      local_340 = s1d + sampleIndex;
      local_34c = sampleIndex;
      for (uVar8 = 0;
          pPVar1 = s2d[sampleIndex].
                   super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)s2d[sampleIndex].
                                super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3);
          uVar8 = uVar8 + 1) {
        auVar15._0_8_ =
             pbrt::
             TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
             ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>(this_02);
        auVar15._8_56_ = extraout_var_00;
        local_390 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar15._0_16_);
        testing::internal::CmpHelperEQ<pbrt::Point2<float>,pbrt::Point2<float>>
                  ((internal *)&gtest_ar,"s2d[s][i]","sampler.Get2D()",
                   (Point2<float> *)((long)&pPVar1->super_Tuple2<pbrt::Point2,_float> + lVar11),
                   (Point2<float> *)&local_390);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_390);
          pcVar9 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_358,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers_test.cpp"
                     ,0x43,pcVar9);
          testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_390);
          testing::internal::AssertHelper::~AssertHelper(&local_358);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_390);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        pfVar2 = (local_340->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        FVar13 = pbrt::
                 TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>(this_02);
        local_390.x = FVar13;
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar,"s1d[s][i]","sampler.Get1D()",
                   (float *)((long)pfVar2 + lVar10),&local_390.x);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_390);
          pcVar9 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_358,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers_test.cpp"
                     ,0x44,pcVar9);
          testing::internal::AssertHelper::operator=(&local_358,(Message *)&local_390);
          testing::internal::AssertHelper::~AssertHelper(&local_358);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_390);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        lVar11 = lVar11 + 8;
        lVar10 = lVar10 + 4;
      }
      sampleIndex = local_34c - 1;
    }
    lVar11 = 0x168;
    do {
      std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
                ((_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                 ((long)&s2d[0].
                         super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11));
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
    lVar11 = 0x168;
    do {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)
                 ((long)&s1d[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar11));
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
  }
  std::_Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::~_Vector_base
            (&samplers.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
            );
  return;
}

Assistant:

TEST(Sampler, ConsistentValues) {
    constexpr int rootSpp = 4;
    constexpr int spp = rootSpp * rootSpp;
    Point2i resolution(100, 101);

    std::vector<SamplerHandle> samplers;
    samplers.push_back(new HaltonSampler(spp, resolution));
    samplers.push_back(new RandomSampler(spp));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::None));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::PermuteDigits));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::FastOwen));
    samplers.push_back(new PaddedSobolSampler(spp, RandomizeStrategy::Owen));
    samplers.push_back(new ZSobolSampler(spp, resolution, RandomizeStrategy::None));
    samplers.push_back(new ZSobolSampler(spp, resolution, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new ZSobolSampler(spp, resolution, RandomizeStrategy::PermuteDigits));
    samplers.push_back(new ZSobolSampler(spp, resolution, RandomizeStrategy::FastOwen));
    samplers.push_back(new ZSobolSampler(spp, resolution, RandomizeStrategy::Owen));
    samplers.push_back(new PMJ02BNSampler(spp));
    samplers.push_back(new StratifiedSampler(rootSpp, rootSpp, true));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::None));
    samplers.push_back(
        new SobolSampler(spp, resolution, RandomizeStrategy::CranleyPatterson));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::PermuteDigits));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::Owen));
    samplers.push_back(new SobolSampler(spp, resolution, RandomizeStrategy::FastOwen));

    for (auto &sampler : samplers) {
        std::vector<Float> s1d[spp];
        std::vector<Point2f> s2d[spp];

        for (int s = 0; s < spp; ++s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < 10; ++i) {
                s2d[s].push_back(sampler.Get2D());
                s1d[s].push_back(sampler.Get1D());
            }
        }

        // Go somewhere else and generate some samples, just to make sure
        // things are shaken up.
        sampler.StartPixelSample({0, 6}, 10);
        sampler.Get2D();
        sampler.Get2D();
        sampler.Get1D();

        // Now go back and generate samples again, but enumerate them in a
        // different order to make sure the sampler is doing the right
        // thing.
        for (int s = spp - 1; s >= 0; --s) {
            sampler.StartPixelSample({1, 5}, s);
            for (int i = 0; i < s2d[s].size(); ++i) {
                EXPECT_EQ(s2d[s][i], sampler.Get2D());
                EXPECT_EQ(s1d[s][i], sampler.Get1D());
            }
        }
    }
}